

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

FilterInfo * __thiscall
helics::FilterFederate::getFilterInfo
          (FilterFederate *this,GlobalFederateId fed,InterfaceHandle handle)

{
  BaseType BVar1;
  FilterInfo *pFVar2;
  GlobalHandle local_8;
  
  BVar1 = (this->mFedID).gid;
  local_8.fed_id.gid = fed.gid;
  if ((this->mCoreID).gid == fed.gid) {
    local_8.fed_id.gid = BVar1;
  }
  if (fed.gid == 0) {
    local_8.fed_id.gid = BVar1;
  }
  local_8.handle.hid = handle.hid;
  pFVar2 = gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::find
                     (&this->filters,&local_8);
  return pFVar2;
}

Assistant:

FilterInfo* FilterFederate::getFilterInfo(GlobalFederateId fed, InterfaceHandle handle)
{
    if (fed == parent_broker_id || fed == mCoreID) {
        fed = mFedID;
    }
    return filters.find(GlobalHandle{fed, handle});
}